

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

HashUtil * __thiscall cfd::core::HashUtil::operator<<(HashUtil *this,string *str)

{
  uint32_t size;
  uint8_t *buffer;
  ByteData local_30;
  string *local_18;
  string *str_local;
  HashUtil *this_local;
  
  local_18 = str;
  str_local = (string *)this;
  buffer = (uint8_t *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  ByteData::ByteData(&local_30,buffer,size);
  ByteData::Push(&this->buffer_,&local_30);
  ByteData::~ByteData((ByteData *)0x3ecf31);
  return this;
}

Assistant:

HashUtil &HashUtil::operator<<(const std::string &str) {
  buffer_.Push(ByteData(
      reinterpret_cast<const uint8_t *>(str.data()),
      static_cast<uint32_t>(str.size())));
  return *this;
}